

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O0

void setup_states(void)

{
  bool bVar1;
  long lVar2;
  Btor2Sort *pBVar3;
  reference pvVar4;
  Btor2Line *state;
  iterator __end1;
  iterator __begin1;
  vector<Btor2Line_*,_std::allocator<Btor2Line_*>_> *__range1;
  Btor2Sort *sort;
  Btor2Line *l;
  int i;
  vector<Btor2Line_*,_std::allocator<Btor2Line_*>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  Btor2SortTag in_stack_ffffffffffffffc4;
  Btor2Parser *in_stack_ffffffffffffffc8;
  Btor2Line *in_stack_ffffffffffffffd0;
  __normal_iterator<Btor2Line_**,_std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>_>
  in_stack_ffffffffffffffd8;
  vector<BtorSimState,_std::allocator<BtorSimState>_> *in_stack_ffffffffffffffe0;
  int local_4;
  
  std::vector<BtorSimState,_std::allocator<BtorSimState>_>::resize
            (in_stack_ffffffffffffffe0,(size_type)in_stack_ffffffffffffffd8._M_current);
  std::vector<BtorSimState,_std::allocator<BtorSimState>_>::resize
            (in_stack_ffffffffffffffe0,(size_type)in_stack_ffffffffffffffd8._M_current);
  if ((dump_vcd & 1U) != 0) {
    std::vector<BtorSimState,_std::allocator<BtorSimState>_>::resize
              (in_stack_ffffffffffffffe0,(size_type)in_stack_ffffffffffffffd8._M_current);
  }
  for (local_4 = 0; local_4 < num_format_lines; local_4 = local_4 + 1) {
    lVar2 = btor2parser_get_line_by_id(model,(long)local_4);
    if (lVar2 != 0) {
      pBVar3 = get_sort(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffc4 = pBVar3->tag;
      if (in_stack_ffffffffffffffc4 == BTOR2_TAG_SORT_array) {
        pvVar4 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                           (&current_state,(long)local_4);
        pvVar4->type = ARRAY;
        pvVar4 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                           (&next_state,(long)local_4);
        pvVar4->type = ARRAY;
        if ((dump_vcd & 1U) != 0) {
          pvVar4 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                             (&vcd_writer->prev_value,(long)local_4);
          pvVar4->type = ARRAY;
        }
      }
      else if (in_stack_ffffffffffffffc4 == BTOR2_TAG_SORT_bitvec) {
        pvVar4 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                           (&current_state,(long)local_4);
        pvVar4->type = BITVEC;
        pvVar4 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                           (&next_state,(long)local_4);
        pvVar4->type = BITVEC;
        if ((dump_vcd & 1U) != 0) {
          pvVar4 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                             (&vcd_writer->prev_value,(long)local_4);
          pvVar4->type = BITVEC;
        }
      }
      else {
        die("Unknown sort");
      }
    }
  }
  std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::begin(in_stack_ffffffffffffffb8);
  std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::end(in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Btor2Line_**,_std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (__normal_iterator<Btor2Line_**,_std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    __gnu_cxx::
    __normal_iterator<Btor2Line_**,_std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>_>::
    operator*((__normal_iterator<Btor2Line_**,_std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>_>
               *)&stack0xffffffffffffffd8);
    __gnu_cxx::
    __normal_iterator<Btor2Line_**,_std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>_>::
    operator++((__normal_iterator<Btor2Line_**,_std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>_>
                *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void
setup_states ()
{
  current_state.resize (num_format_lines);
  next_state.resize (num_format_lines);
  if (dump_vcd) vcd_writer->prev_value.resize (num_format_lines);

  for (int i = 0; i < num_format_lines; i++)
  {
    Btor2Line *l = btor2parser_get_line_by_id (model, i);
    if (l)
    {
      Btor2Sort *sort = get_sort (l, model);
      switch (sort->tag)
      {
        case BTOR2_TAG_SORT_bitvec:
          current_state[i].type = BtorSimState::Type::BITVEC;
          next_state[i].type    = BtorSimState::Type::BITVEC;
          if (dump_vcd)
          {
            vcd_writer->prev_value[i].type = BtorSimState::Type::BITVEC;
          }
          break;
        case BTOR2_TAG_SORT_array:
          current_state[i].type = BtorSimState::Type::ARRAY;
          next_state[i].type    = BtorSimState::Type::ARRAY;
          if (dump_vcd)
          {
            vcd_writer->prev_value[i].type = BtorSimState::Type::ARRAY;
          }
          break;
        default: die ("Unknown sort");
      }
    }
  }

  for (auto state : states)
  {
    assert (current_state[state->id].type != BtorSimState::Type::INVALID);
    assert (next_state[state->id].type != BtorSimState::Type::INVALID);
  }
}